

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cc
# Opt level: O3

void __thiscall test_vector_assumptions::test_method(test_vector_assumptions *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar1;
  long lVar2;
  long local_1a8;
  long local_1a0;
  long *local_198;
  long *local_190;
  char *local_188;
  shared_count sStack_180;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  values_2;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> values;
  undefined **local_138;
  undefined1 local_130;
  undefined8 *local_128;
  long **local_120;
  undefined1 local_118 [8];
  undefined **local_110;
  ulong local_108;
  shared_count sStack_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&values,10);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1f);
  local_108 = local_108 & 0xffffffffffffff00;
  local_110 = &PTR__lazy_ostream_001843b8;
  sStack_100.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_1a8._0_4_ = 10;
  local_1a0 = (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_118 = (undefined1  [8])&local_1a0;
  local_188 = (char *)0x0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_e8 = "";
  local_120 = &local_198;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_001846f8;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)values_2.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00184128;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_198 = &local_1a8;
  local_160 = (undefined1  [8])local_118;
  local_190._0_1_ =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x28;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x20);
  local_108 = local_108 & 0xffffffffffffff00;
  local_110 = &PTR__lazy_ostream_001843b8;
  sStack_100.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_1a8 = CONCAT44(local_1a8._4_4_,5);
  local_1a0 = (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_190 = (long *)CONCAT71(local_190._1_7_,
                               (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 0x28);
  local_188 = (char *)0x0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_e8 = "";
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_001846f8;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_198;
  local_118 = (undefined1  [8])&local_1a0;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)values_2.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00184128;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_198 = &local_1a8;
  local_160 = (undefined1  [8])local_118;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  if (values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&values,10);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x25);
  local_1a0 = ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_108 = local_108 & 0xffffffffffffff00;
  local_110 = &PTR__lazy_ostream_001843b8;
  sStack_100.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_1a8 = CONCAT44(local_1a8._4_4_,10);
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_001846f8;
  local_188 = (char *)0x0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)values_2.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_e8 = "";
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_198;
  local_118 = (undefined1  [8])&local_1a0;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00184128;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_198 = &local_1a8;
  local_160 = (undefined1  [8])local_118;
  local_190._0_1_ =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start == 0xf0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x26);
  local_108 = local_108 & 0xffffffffffffff00;
  local_110 = &PTR__lazy_ostream_001843b8;
  sStack_100.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_1a0 = 0xf0;
  local_1a8 = (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_190 = (long *)CONCAT71(local_190._1_7_,local_1a8 == 0xf0);
  local_188 = (char *)0x0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
  ;
  local_e8 = "";
  local_198 = &local_1a0;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_00184128;
  local_128 = &boost::unit_test::lazy_ostream::inst;
  local_120 = &local_198;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)values_2.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00184128;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_160 = (undefined1  [8])local_118;
  local_118 = (undefined1  [8])&local_1a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&values);
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values_2.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&values_2,10);
  lVar2 = 0;
  do {
    pvVar1 = *(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               **)((long)&values_2.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar2);
    local_c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x3a,&local_d0);
    local_110 = (undefined **)
                CONCAT71(local_110._1_7_,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_160 <= pvVar1 || pvVar1 < &values_2);
    local_108 = 0;
    sStack_100.pi_ = (sp_counted_base *)0x0;
    local_190 = (long *)0x172327;
    local_188 = "";
    local_130 = 0;
    local_138 = &PTR__lazy_ostream_00184378;
    local_128 = &boost::unit_test::lazy_ostream::inst;
    local_120 = &local_190;
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_containers.cc"
    ;
    local_d8 = "";
    boost::test_tools::tt_detail::report_assertion(&local_110,&local_138,&local_e0,0x3a,2,0,0);
    boost::detail::shared_count::~shared_count(&sStack_100);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&values_2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_vector_getElementCount )
{
    Registry registry;
    import_test_types(registry);
    Container const& container = Container::createContainer(registry, "/std/vector", *registry.get("B"));

    std::vector<B> vector;
    vector.resize(10);
    BOOST_REQUIRE_EQUAL(10, container.getElementCount(&vector));
}